

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void llvm::SmallVectorTemplateBase<std::pair<unsigned_long,_llvm::DILineInfo>,_false>::destroy_range
               (pair<unsigned_long,_llvm::DILineInfo> *S,pair<unsigned_long,_llvm::DILineInfo> *E)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  if (E != S) {
    do {
      pcVar2 = E[-1].second.FunctionName._M_dataplus._M_p;
      paVar1 = &E[-1].second.FunctionName.field_2;
      if (paVar1 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)pcVar2) {
        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
      }
      pcVar2 = E[-1].second.FileName._M_dataplus._M_p;
      paVar1 = &E[-1].second.FileName.field_2;
      if (paVar1 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)pcVar2) {
        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
      }
      E = E + -1;
    } while (E != S);
  }
  return;
}

Assistant:

static void destroy_range(T *S, T *E) {
    while (S != E) {
      --E;
      E->~T();
    }
  }